

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O0

void __thiscall
Impl2T<poly::virtual_cloning_policy>::Impl2T
          (Impl2T<poly::virtual_cloning_policy> *this,Impl2T<poly::virtual_cloning_policy> *o)

{
  double *__p;
  Impl2T<poly::virtual_cloning_policy> *o_local;
  Impl2T<poly::virtual_cloning_policy> *this_local;
  
  Interface::Interface(&this->super_Interface,&o->super_Interface);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR_function_005cb620;
  poly::vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::vector(&this->v)
  ;
  __p = (double *)operator_new__(0x448);
  std::unique_ptr<double[],std::default_delete<double[]>>::
  unique_ptr<double*,std::default_delete<double[]>,void,bool>
            ((unique_ptr<double[],std::default_delete<double[]>> *)&this->p,__p);
  Cookie::Cookie(&this->cookie);
  Cookie::set(&this->cookie);
  return;
}

Assistant:

Impl2T(const Impl2T& o)
        : Interface(o)
        , p { new double[137] }
    {
        cookie.set();
    }